

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O0

Visibility glu::parseWindowVisibility(CommandLine *cmdLine)

{
  WindowVisibility WVar1;
  InternalError *this;
  allocator<char> local_39;
  string local_38;
  CommandLine *local_18;
  CommandLine *cmdLine_local;
  
  local_18 = cmdLine;
  WVar1 = tcu::CommandLine::getVisibility(cmdLine);
  if (WVar1 == WINDOWVISIBILITY_WINDOWED) {
    cmdLine_local._4_4_ = VISIBILITY_VISIBLE;
  }
  else if (WVar1 == WINDOWVISIBILITY_FULLSCREEN) {
    cmdLine_local._4_4_ = VISIBILITY_FULLSCREEN;
  }
  else {
    if (WVar1 != WINDOWVISIBILITY_HIDDEN) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Unsupported window visibility",&local_39);
      tcu::InternalError::InternalError(this,&local_38);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    cmdLine_local._4_4_ = VISIBILITY_HIDDEN;
  }
  return cmdLine_local._4_4_;
}

Assistant:

RenderConfig::Visibility parseWindowVisibility (const tcu::CommandLine& cmdLine)
{
	switch (cmdLine.getVisibility())
	{
		case tcu::WINDOWVISIBILITY_HIDDEN:		return RenderConfig::VISIBILITY_HIDDEN;
		case tcu::WINDOWVISIBILITY_WINDOWED:	return RenderConfig::VISIBILITY_VISIBLE;
		case tcu::WINDOWVISIBILITY_FULLSCREEN:	return RenderConfig::VISIBILITY_FULLSCREEN;
		default:
			throw tcu::InternalError("Unsupported window visibility");
	}
}